

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O3

bool senjo::ParamValue(string *value,char **params,string *next)

{
  byte *pbVar1;
  size_type sVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  bool bVar9;
  char *pcVar10;
  
  pcVar10 = *params;
  if (pcVar10 != (char *)0x0) {
    cVar4 = *pcVar10;
    while (cVar4 != '\0') {
      iVar5 = isspace((int)cVar4);
      if (iVar5 == 0) {
        sVar2 = next->_M_string_length;
        if ((sVar2 == 0) ||
           (pcVar6 = strstr(pcVar10,(next->_M_dataplus)._M_p), pcVar6 == (char *)0x0))
        goto LAB_00136865;
        pcVar3 = (next->_M_dataplus)._M_p;
        goto LAB_0013681f;
      }
      *params = pcVar10 + 1;
      cVar4 = pcVar10[1];
      pcVar10 = pcVar10 + 1;
    }
  }
  return false;
LAB_0013681f:
  do {
    uVar8 = (uint)pcVar6[sVar2];
    if ((uVar8 == 0) || (iVar5 = isspace(uVar8), iVar5 != 0)) goto LAB_00136879;
    pcVar6 = pcVar6 + sVar2;
    do {
      iVar5 = isspace((int)(char)uVar8);
      if (iVar5 != 0) break;
      pbVar1 = (byte *)(pcVar6 + 1);
      uVar8 = (uint)*pbVar1;
      pcVar6 = pcVar6 + 1;
    } while (*pbVar1 != 0);
    pcVar6 = strstr(pcVar6,pcVar3);
  } while (pcVar6 != (char *)0x0);
LAB_00136865:
  sVar7 = strlen(pcVar10);
  pcVar6 = pcVar10 + sVar7;
LAB_00136879:
  do {
    if (pcVar6 <= pcVar10) break;
    pcVar3 = pcVar6 + -1;
    pcVar6 = pcVar6 + -1;
    iVar5 = isspace((int)*pcVar3);
  } while (iVar5 != 0);
  bVar9 = false;
  std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar10);
  sVar2 = value->_M_string_length;
  if (sVar2 != 0) {
    pcVar10 = *params;
    *params = pcVar10 + sVar2;
    cVar4 = pcVar10[sVar2];
    bVar9 = true;
    if (cVar4 != '\0') {
      pcVar10 = pcVar10 + sVar2;
      do {
        pcVar10 = pcVar10 + 1;
        iVar5 = isspace((int)cVar4);
        if (iVar5 == 0) {
          return true;
        }
        *params = pcVar10;
        cVar4 = *pcVar10;
      } while (cVar4 != '\0');
    }
  }
  return bVar9;
}

Assistant:

static inline bool ParamValue(std::string& value, const char*& params,
                              const std::string& next)
{
  if (params && *NextWord(params)) {
    const char* end = next.size() ? strstr(params, next.c_str()) : NULL;
    while (end && end[next.size()] && !isspace(end[next.size()])) {
      NextSpace(end += next.size());
      end = strstr(end, next.c_str());
    }
    if (!end) {
      end = (params + strlen(params));
    }
    while ((end > params) && isspace(end[-1])) {
      --end;
    }
    value.assign(params, (end - params));
    if (value.size()) {
      NextWord(params += value.size());
      return true;
    }
  }
  return false;
}